

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall
ghc::filesystem::recursive_directory_iterator::pop
          (recursive_directory_iterator *this,error_code *ec)

{
  element_type *peVar1;
  _Map_pointer ppdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  directory_iterator *pdVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  _Elt_pointer pdVar7;
  directory_iterator *pdVar8;
  directory_iterator local_48;
  
  peVar1 = (this->_impl).
           super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ppdVar2 = *(_Map_pointer *)
             ((long)&(peVar1->_dir_iter_stack).c.
                     super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                     ._M_impl + 0x48);
  if ((int)((ulong)((long)*(_Elt_pointer *)
                           ((long)&(peVar1->_dir_iter_stack).c.
                                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                   ._M_impl + 0x20) -
                   (long)((iterator *)
                         ((long)&(peVar1->_dir_iter_stack).c.
                                 super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                 ._M_impl + 0x10))->_M_cur) >> 4) +
      (int)((ulong)((long)((iterator *)
                          ((long)&(peVar1->_dir_iter_stack).c.
                                  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                  ._M_impl + 0x30))->_M_cur -
                   (long)*(_Elt_pointer *)
                          ((long)&(peVar1->_dir_iter_stack).c.
                                  super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                  ._M_impl + 0x38)) >> 4) +
      ((((uint)((int)ppdVar2 -
               *(int *)((long)&(peVar1->_dir_iter_stack).c.
                               super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                               ._M_impl + 0x28)) >> 3) - 1) + (uint)(ppdVar2 == (_Map_pointer)0x0))
      * 0x20 == 1) {
    recursive_directory_iterator((recursive_directory_iterator *)&local_48);
    _Var5._M_pi = local_48._impl.
                  super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_48._impl.
             super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_48._impl.
    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_48._impl.
    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->_impl).
              super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->_impl).
    super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)peVar4;
    (this->_impl).
    super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var5._M_pi;
    if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
       local_48._impl.
       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    do {
      std::
      deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
      ::pop_back(&(((this->_impl).
                    super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_dir_iter_stack).c);
      peVar1 = (this->_impl).
               super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pdVar7 = ((iterator *)
               ((long)&(peVar1->_dir_iter_stack).c.
                       super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                       ._M_impl + 0x30))->_M_cur;
      if (pdVar7 == *(_Elt_pointer *)
                     ((long)&(peVar1->_dir_iter_stack).c.
                             super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                             ._M_impl + 0x38)) {
        pdVar7 = (*(_Map_pointer *)
                   ((long)&(peVar1->_dir_iter_stack).c.
                           super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                           ._M_impl + 0x48))[-1] + 0x20;
      }
      directory_iterator::impl::increment
                (pdVar7[-1]._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,ec);
      peVar1 = (this->_impl).
               super___shared_ptr<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      ppdVar2 = *(_Map_pointer *)
                 ((long)&(peVar1->_dir_iter_stack).c.
                         super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                         ._M_impl + 0x48);
      pdVar8 = ((iterator *)
               ((long)&(peVar1->_dir_iter_stack).c.
                       super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                       ._M_impl + 0x30))->_M_cur;
      pdVar3 = *(_Elt_pointer *)
                ((long)&(peVar1->_dir_iter_stack).c.
                        super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                        ._M_impl + 0x38);
      if ((int)((ulong)((long)*(_Elt_pointer *)
                               ((long)&(peVar1->_dir_iter_stack).c.
                                       super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                       ._M_impl + 0x20) -
                       (long)((iterator *)
                             ((long)&(peVar1->_dir_iter_stack).c.
                                     super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                     ._M_impl + 0x10))->_M_cur) >> 4) +
          (int)((ulong)((long)pdVar8 - (long)pdVar3) >> 4) +
          ((((uint)((int)ppdVar2 -
                   *(int *)((long)&(peVar1->_dir_iter_stack).c.
                                   super__Deque_base<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>
                                   ._M_impl + 0x28)) >> 3) - 1) +
          (uint)(ppdVar2 == (_Map_pointer)0x0)) * 0x20 == 1) {
        return;
      }
      if (pdVar8 == pdVar3) {
        pdVar8 = ppdVar2[-1] + 0x20;
      }
      directory_iterator::directory_iterator(&local_48);
      bVar6 = filesystem::operator==
                        (&(pdVar8[-1]._impl.
                           super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_current,
                         &(local_48._impl.
                           super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_current);
      if (local_48._impl.
          super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48._impl.
                   super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    } while (bVar6);
  }
  return;
}

Assistant:

GHC_INLINE void recursive_directory_iterator::pop(std::error_code& ec)
{
    if (depth() == 0) {
        *this = recursive_directory_iterator();
    }
    else {
        do {
            _impl->_dir_iter_stack.pop();
            _impl->_dir_iter_stack.top().increment(ec);
        } while (depth() && _impl->_dir_iter_stack.top() == directory_iterator());
    }
}